

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O3

void __thiscall SortedRun::do_and(SortedRun *this,SortedRun *other)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  IntersectionHelper helper;
  IntersectionHelper local_68;
  
  decompress(this);
  puVar2 = (other->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (other->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    validate_compression(other,false);
    puVar8 = (other->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    validate_compression(other,false);
    puVar4 = (other->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    validate_compression(this,false);
    puVar7 = (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    validate_compression(this,false);
    puVar5 = (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    validate_compression(this,false);
    puVar6 = (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar7 != puVar5 && puVar8 != puVar4) {
      do {
        uVar1 = *puVar8;
        if (uVar1 < *puVar7) {
          puVar8 = puVar8 + 1;
        }
        else if (*puVar7 < uVar1) {
          puVar7 = puVar7 + 1;
        }
        else {
          *puVar6 = uVar1;
          puVar8 = puVar8 + 1;
          puVar7 = puVar7 + 1;
          puVar6 = puVar6 + 1;
        }
      } while ((puVar8 != puVar4) && (puVar7 != puVar5));
    }
  }
  else {
    local_68.prev_ = -1;
    local_68.seq_start_ =
         (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_68.seq_end_ =
         (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68.run_it_ = puVar2;
    local_68.run_end_ = puVar3;
    local_68.seq_it_ = local_68.seq_start_;
    local_68.seq_out_ = local_68.seq_start_;
    IntersectionHelper::intersect(&local_68);
    validate_compression(this,false);
    puVar6 = (uint *)((long)local_68.seq_out_ +
                     ((long)(this->sequence_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)local_68.seq_start_));
  }
  validate_compression(this,false);
  if (puVar6 != (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar6;
  }
  return;
}

Assistant:

void SortedRun::do_and(SortedRun &other) {
    decompress();
    std::vector<uint32_t>::iterator new_end;
    if (other.is_compressed()) {
        IntersectionHelper helper(&sequence_, &other.run_);
        helper.intersect();
        new_end = begin() + helper.result_size();
    } else {
        new_end = std::set_intersection(other.begin(), other.end(), begin(),
                                        end(), begin());
    }
    sequence_.erase(new_end, end());
}